

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_fill_deviate_default
              (ly_ctx *ctx,lys_deviate *deviate,lys_node *dev_target,ly_set *dflt_check,char *value)

{
  byte *pbVar1;
  lys_ext_instance ***ext;
  byte bVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  lys_node *plVar7;
  LY_ECODE ecode;
  lys_ext_instance **ext_00;
  ly_ctx *plVar8;
  char *pcVar9;
  ulong uVar10;
  lys_node *local_50;
  lys_node *node;
  uint8_t *local_40;
  ly_ctx *local_38;
  
  local_38 = ctx;
  sVar5 = strlen(value);
  plVar8 = local_38;
  if (dev_target->nodetype == LYS_LEAF) {
    plVar7 = dev_target[1].prev;
    if (deviate->mod != LY_DEVIATE_DEL) {
      lydict_remove(local_38,(char *)plVar7);
      pbVar1 = (byte *)((long)&dev_target->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      plVar7 = (lys_node *)lydict_insert(plVar8,value,sVar5 & 0xffffffff);
      dev_target[1].prev = plVar7;
      ly_set_add(dflt_check,dev_target,0);
      return 0;
    }
    if (plVar7 != (lys_node *)0x0 && plVar7 == (lys_node *)value) {
      lydict_remove(local_38,(char *)plVar7);
      dev_target[1].prev = (lys_node *)0x0;
      pbVar1 = (byte *)((long)&dev_target->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,'\0',LYEXT_SUBSTMT_DEFAULT);
      if (iVar4 != -1) {
        do {
          lyp_ext_instance_rm(plVar8,&dev_target->ext,&dev_target->ext_size,(uint8_t)iVar4);
          iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(uint8_t)iVar4,
                               LYEXT_SUBSTMT_DEFAULT);
        } while (iVar4 != -1);
        return 0;
      }
      return 0;
    }
    ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"default");
    pcVar9 = "Value differs from the target being deleted.";
  }
  else if (dev_target->nodetype == LYS_CHOICE) {
    iVar4 = resolve_choice_default_schema_nodeid(value,dev_target->child,&local_50);
    plVar8 = local_38;
    if (iVar4 != 0 || local_50 == (lys_node *)0x0) {
      ecode = LYE_INARG;
      pcVar9 = value;
      value = "default";
LAB_0015423d:
      ly_vlog(plVar8,ecode,LY_VLOG_NONE,(void *)0x0,pcVar9,value);
      return 1;
    }
    if (deviate->mod != LY_DEVIATE_DEL) {
      dev_target[1].name = (char *)local_50;
      return 0;
    }
    if ((lys_node *)dev_target[1].name != (lys_node *)0x0 &&
        (lys_node *)dev_target[1].name == local_50) {
      dev_target[1].name = (char *)0x0;
      iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,'\0',LYEXT_SUBSTMT_DEFAULT);
      plVar8 = local_38;
      if (iVar4 != -1) {
        do {
          lyp_ext_instance_rm(plVar8,&dev_target->ext,&dev_target->ext_size,(uint8_t)iVar4);
          iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,(uint8_t)iVar4,
                               LYEXT_SUBSTMT_DEFAULT);
        } while (iVar4 != -1);
        return 0;
      }
      return 0;
    }
    ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"default");
    pcVar9 = "Value differs from the target being deleted.";
  }
  else {
    bVar2 = dev_target->padding[2];
    uVar6 = (ulong)bVar2;
    if (deviate->mod != LY_DEVIATE_DEL) {
      if (bVar2 != 0) {
        uVar10 = 0;
        do {
          if (*(char **)((dev_target[1].prev)->padding + uVar10 * 8 + -0x1c) == value) {
            ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"default");
            pcVar9 = "Duplicated default value \"%s\".";
            ecode = LYE_SPEC;
            goto LAB_0015423d;
          }
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      pcVar9 = lydict_insert(local_38,value,sVar5 & 0xffffffff);
      plVar7 = dev_target[1].prev;
      bVar2 = dev_target->padding[2];
      dev_target->padding[2] = bVar2 + 1;
      *(char **)(plVar7->padding + (ulong)bVar2 * 8 + -0x1c) = pcVar9;
      ly_set_add(dflt_check,dev_target,0);
      pbVar1 = (byte *)((long)&dev_target->flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      return 0;
    }
    uVar10 = 0;
    if (uVar6 != 0) {
      uVar10 = 0;
      do {
        pcVar9 = *(char **)((dev_target[1].prev)->padding + uVar10 * 8 + -0x1c);
        if (pcVar9 == value && pcVar9 != (char *)0x0) {
          lydict_remove(dev_target->module->ctx,pcVar9);
          *(undefined8 *)((dev_target[1].prev)->padding + uVar10 * 8 + -0x1c) = 0;
          iVar4 = lys_ext_iter(dev_target->ext,dev_target->ext_size,'\0',LYEXT_SUBSTMT_DEFAULT);
          if (iVar4 != -1) {
            ext = &dev_target->ext;
            local_40 = &dev_target->ext_size;
            node = (lys_node *)value;
            do {
              puVar3 = local_40;
              ext_00 = *ext;
              bVar2 = ext_00[iVar4]->insubstmt_index;
              if ((uint)bVar2 == (uint)uVar10) {
                lyp_ext_instance_rm(local_38,ext,local_40,(uint8_t)iVar4);
                iVar4 = iVar4 + -1;
                ext_00 = *ext;
              }
              else if ((uint)uVar10 < (uint)bVar2) {
                ext_00[iVar4]->insubstmt_index = bVar2 - 1;
              }
              iVar4 = lys_ext_iter(ext_00,*puVar3,(char)iVar4 + '\x01',LYEXT_SUBSTMT_DEFAULT);
              value = (char *)node;
            } while (iVar4 != -1);
          }
          goto LAB_00154272;
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      uVar10 = (ulong)bVar2;
    }
LAB_00154272:
    plVar8 = local_38;
    if ((uint)uVar10 != (uint)dev_target->padding[2]) {
      return 0;
    }
    ly_vlog(local_38,LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"default");
    pcVar9 = "The default value to delete not found in the target node.";
  }
  ly_vlog(plVar8,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar9);
  return 1;
}

Assistant:

int
yang_fill_deviate_default(struct ly_ctx *ctx, struct lys_deviate *deviate, struct lys_node *dev_target,
                          struct ly_set *dflt_check, const char *value)
{
    struct lys_node *node;
    struct lys_node_choice *choice;
    struct lys_node_leaf *leaf;
    struct lys_node_leaflist *llist;
    int rc, i, j;
    unsigned int u;

    u = strlen(value);
    if (dev_target->nodetype == LYS_CHOICE) {
        choice = (struct lys_node_choice *)dev_target;
        rc = resolve_choice_default_schema_nodeid(value, choice->child, (const struct lys_node **)&node);
        if (rc || !node) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
            goto error;
        }
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!choice->dflt || (choice->dflt != node)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            choice->dflt = NULL;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add or replace */
            choice->dflt = node;
            if (!choice->dflt) {
                /* default branch not found */
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                goto error;
            }
        }
    } else if (dev_target->nodetype == LYS_LEAF) {
        leaf = (struct lys_node_leaf *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            if (!leaf->dflt || !ly_strequal(leaf->dflt, value, 1)) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
                goto error;
            }
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->dflt = NULL;
            leaf->flags &= ~LYS_DFLTJSON;
            /* remove extensions of this default instance from the target node */
            j = -1;
            while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                --j;
            }
        } else { /* add (already checked) and replace */
            /* remove value */
            lydict_remove(ctx, leaf->dflt);
            leaf->flags &= ~LYS_DFLTJSON;

            /* set new value */
            leaf->dflt = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
        }
    } else { /* LYS_LEAFLIST */
        llist = (struct lys_node_leaflist *)dev_target;
        if (deviate->mod == LY_DEVIATE_DEL) {
            /* find and remove the value in target list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (llist->dflt[i] && ly_strequal(llist->dflt[i], value, 1)) {
                    /* match, remove the value */
                    lydict_remove(llist->module->ctx, llist->dflt[i]);
                    llist->dflt[i] = NULL;
                    /* remove extensions of this default instance from the target node */
                    j = -1;
                    while ((j = lys_ext_iter(dev_target->ext, dev_target->ext_size, j + 1, LYEXT_SUBSTMT_DEFAULT)) != -1) {
                        if (dev_target->ext[j]->insubstmt_index == i) {
                            lyp_ext_instance_rm(ctx, &dev_target->ext, &dev_target->ext_size, j);
                            --j;
                        } else if (dev_target->ext[j]->insubstmt_index > i) {
                            /* decrease the substatement index of the extension because of the changed array of defaults */
                            dev_target->ext[j]->insubstmt_index--;
                        }
                    }
                    break;
                }
            }
            if (i == llist->dflt_size) {
                LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The default value to delete not found in the target node.");
                goto error;
            }
        } else {
            /* add or replace, anyway we place items into the deviate's list
               which propagates to the target */
            /* we just want to check that the value isn't already in the list */
            for (i = 0; i < llist->dflt_size; i++) {
                if (ly_strequal(llist->dflt[i], value, 1)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, value, "default");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Duplicated default value \"%s\".", value);
                    goto error;
                }
            }
            /* store it in target node */
            llist->dflt[llist->dflt_size++] = lydict_insert(ctx, value, u);

            /* remember to check it later (it may not fit now, but the type can be deviated too) */
            ly_set_add(dflt_check, dev_target, 0);
            llist->flags &= ~LYS_DFLTJSON;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}